

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void * address_space_map_aarch64
                 (AddressSpace *as,hwaddr addr,hwaddr *plen,_Bool is_write,MemTxAttrs attrs)

{
  uc_struct_conflict12 *puVar1;
  uc_struct_conflict7 *puVar2;
  byte bVar3;
  MemoryRegion *pMVar4;
  MemoryRegion *pMVar5;
  void *pvVar6;
  hwaddr done;
  hwaddr hVar7;
  ulong alignment;
  undefined1 lock;
  hwaddr *plen_00;
  hwaddr hVar8;
  hwaddr l;
  hwaddr xlat;
  hwaddr xlat_1;
  ulong local_70;
  hwaddr local_68;
  MemTxAttrs local_5c;
  AddressSpace *local_58;
  hwaddr *local_50;
  FlatView *local_48;
  ram_addr_t local_40;
  hwaddr local_38;
  
  hVar8 = *plen;
  if (hVar8 == 0) {
    return (void *)0x0;
  }
  puVar1 = as->uc;
  plen_00 = &local_70;
  local_48 = as->current_map;
  local_70 = hVar8;
  local_5c = attrs;
  local_58 = as;
  local_50 = plen;
  pMVar4 = flatview_translate_aarch64
                     ((uc_struct_conflict2 *)as,local_48,addr,&local_40,plen_00,is_write,attrs);
  bVar3 = pMVar4->ram;
  if (is_write) {
    if ((_Bool)bVar3 == false) goto LAB_005def27;
    bVar3 = pMVar4->readonly ^ 1;
  }
  if (bVar3 != 0) {
    local_68 = local_70;
    hVar7 = 0;
    while( true ) {
      lock = SUB81(plen_00,0);
      hVar7 = hVar7 + local_68;
      hVar8 = hVar8 - local_68;
      if (hVar8 == 0) break;
      addr = addr + local_68;
      plen_00 = &local_68;
      local_68 = hVar8;
      pMVar5 = flatview_translate_aarch64
                         ((uc_struct_conflict2 *)as,local_48,addr,&local_38,plen_00,is_write,
                          local_5c);
      lock = SUB81(plen_00,0);
      if ((pMVar5 != pMVar4) || (local_38 != local_40 + hVar7)) break;
    }
    *local_50 = hVar7;
    pvVar6 = qemu_ram_ptr_length((uc_struct_conflict2 *)local_58->uc,pMVar4->ram_block,local_40,
                                 local_50,(_Bool)lock);
    return pvVar6;
  }
LAB_005def27:
  alignment = (ulong)-puVar1->init_target_page->mask;
  if (alignment <= local_70) {
    local_70 = alignment;
  }
  pvVar6 = qemu_memalign(alignment,local_70);
  puVar2 = pMVar4->uc;
  (puVar2->bounce).buffer = pvVar6;
  (puVar2->bounce).addr = addr;
  (puVar2->bounce).len = local_70;
  (puVar2->bounce).mr = (MemoryRegion_conflict *)pMVar4;
  if (!is_write) {
    flatview_read((uc_struct_conflict2 *)local_58->uc,local_48,addr,(MemTxAttrs)0x1,pvVar6,local_70)
    ;
  }
  *local_50 = local_70;
  return (pMVar4->uc->bounce).buffer;
}

Assistant:

void *address_space_map(AddressSpace *as,
                        hwaddr addr,
                        hwaddr *plen,
                        bool is_write,
                        MemTxAttrs attrs)
{
    hwaddr len = *plen;
    hwaddr l, xlat;
    MemoryRegion *mr;
    void *ptr;
    FlatView *fv;
    struct uc_struct *uc = as->uc;

    if (len == 0) {
        return NULL;
    }

    l = len;
    fv = address_space_to_flatview(as);
    mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);

    if (!memory_access_is_direct(mr, is_write)) {
        /* Avoid unbounded allocations */
        l = MIN(l, TARGET_PAGE_SIZE);
        mr->uc->bounce.buffer = qemu_memalign(TARGET_PAGE_SIZE, l);
        mr->uc->bounce.addr = addr;
        mr->uc->bounce.len = l;

        mr->uc->bounce.mr = mr;
        if (!is_write) {
            flatview_read(as->uc, fv, addr, MEMTXATTRS_UNSPECIFIED,
                               mr->uc->bounce.buffer, l);
        }

        *plen = l;
        return mr->uc->bounce.buffer;
    }


    *plen = flatview_extend_translation(as->uc, fv, addr, len, mr, xlat,
                                        l, is_write, attrs);
    ptr = qemu_ram_ptr_length(as->uc, mr->ram_block, xlat, plen, true);

    return ptr;
}